

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  BlockEntry *pBVar1;
  long lVar2;
  long len;
  longlong pos;
  long local_30;
  longlong local_28;
  
  do {
    lVar2 = Parse(this,&local_28,&local_30);
    if (lVar2 < 0) {
      *pLast = (BlockEntry *)0x0;
      return lVar2;
    }
  } while (lVar2 == 0);
  if (this->m_entries_count < 1) {
    *pLast = (BlockEntry *)0x0;
  }
  else {
    if (this->m_entries == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1cde,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
    }
    pBVar1 = this->m_entries[this->m_entries_count + -1];
    *pLast = pBVar1;
    if (pBVar1 == (BlockEntry *)0x0) {
      __assert_fail("pLast",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1ce3,"long mkvparser::Cluster::GetLast(const BlockEntry *&) const");
    }
  }
  return 0;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}